

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::Limits> *
wasm::WATParser::limits64<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::WATParser::Limits> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  optional<unsigned_long> oVar1;
  optional<unsigned_long> oVar2;
  string local_68;
  Err local_48;
  allocator<char> local_21;
  
  oVar1 = Lexer::takeU<unsigned_long>(&ctx->in);
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected initial size",&local_21);
    Lexer::err(&local_48,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Limits,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::Limits,wasm::Err> *)__return_storage_ptr__,
               &local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    oVar2 = Lexer::takeU<unsigned_long>(&ctx->in);
    *(unsigned_long *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> =
         oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    ((_Storage<unsigned_long,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 8))->_M_value =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    *(bool *)((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x10) =
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Limits,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Limits,_wasm::Err> + 0x20) = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LimitsT> limits64(Ctx& ctx) {
  auto n = ctx.in.takeU64();
  if (!n) {
    return ctx.in.err("expected initial size");
  }
  std::optional<uint64_t> m = ctx.in.takeU64();
  return ctx.makeLimits(uint64_t(*n), m);
}